

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::SetSerializedPbInterval
          (Generator *this,FileDescriptorProto *file)

{
  int iVar1;
  int iVar2;
  EnumDescriptorProto *descriptor_proto;
  DescriptorProto *message_proto;
  Descriptor *descriptor_00;
  ServiceDescriptorProto *descriptor_proto_00;
  string_view sVar3;
  string local_a8;
  string_view local_88;
  ServiceDescriptor *local_78;
  ServiceDescriptor *service;
  int local_68;
  int i_2;
  int i_1;
  string local_58;
  string_view local_38;
  EnumDescriptor *local_28;
  EnumDescriptor *descriptor;
  FileDescriptorProto *pFStack_18;
  int i;
  FileDescriptorProto *file_local;
  Generator *this_local;
  
  descriptor._4_4_ = 0;
  pFStack_18 = file;
  file_local = (FileDescriptorProto *)this;
  while( true ) {
    iVar1 = descriptor._4_4_;
    iVar2 = FileDescriptor::enum_type_count(this->file_);
    if (iVar2 <= iVar1) break;
    local_28 = FileDescriptor::enum_type(this->file_,descriptor._4_4_);
    descriptor_proto = FileDescriptorProto::enum_type(pFStack_18,descriptor._4_4_);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_58,this,local_28);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    local_38 = sVar3;
    PrintSerializedPbInterval<google::protobuf::EnumDescriptorProto>(this,descriptor_proto,sVar3);
    std::__cxx11::string::~string((string *)&local_58);
    descriptor._4_4_ = descriptor._4_4_ + 1;
  }
  local_68 = 0;
  while( true ) {
    iVar1 = local_68;
    iVar2 = FileDescriptor::message_type_count(this->file_);
    if (iVar2 <= iVar1) break;
    message_proto = FileDescriptorProto::message_type(pFStack_18,local_68);
    descriptor_00 = FileDescriptor::message_type(this->file_,local_68);
    SetMessagePbInterval(this,message_proto,descriptor_00);
    local_68 = local_68 + 1;
  }
  service._4_4_ = 0;
  while( true ) {
    iVar1 = service._4_4_;
    iVar2 = FileDescriptor::service_count(this->file_);
    if (iVar2 <= iVar1) break;
    local_78 = FileDescriptor::service(this->file_,service._4_4_);
    descriptor_proto_00 = FileDescriptorProto::service(pFStack_18,service._4_4_);
    ModuleLevelServiceDescriptorName_abi_cxx11_(&local_a8,this,local_78);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
    local_88 = sVar3;
    PrintSerializedPbInterval<google::protobuf::ServiceDescriptorProto>
              (this,descriptor_proto_00,sVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    service._4_4_ = service._4_4_ + 1;
  }
  return;
}

Assistant:

void Generator::SetSerializedPbInterval(const FileDescriptorProto& file) const {
  // Top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& descriptor = *file_->enum_type(i);
    PrintSerializedPbInterval(file.enum_type(i),
                              ModuleLevelDescriptorName(descriptor));
  }

  // Messages.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    SetMessagePbInterval(file.message_type(i), *file_->message_type(i));
  }

  // Services.
  for (int i = 0; i < file_->service_count(); ++i) {
    const ServiceDescriptor& service = *file_->service(i);
    PrintSerializedPbInterval(file.service(i),
                              ModuleLevelServiceDescriptorName(service));
  }
}